

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
::
Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>>>>
          (Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
           *this,Index columnIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,Dimension dimension
          ,vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
           *rowContainer,Column_settings *colSettings)

{
  uint uVar1;
  uint *puVar2;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  *this_00;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
  *__v;
  uint *puVar3;
  ulong uVar4;
  allocator_type local_49;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
  *local_48;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
  *local_40;
  value_type local_38;
  
  *(Index *)this = columnIndex;
  *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  *(Dimension *)(this + 0x10) = dimension;
  local_40 = this + 0x18;
  uVar4 = 0;
  local_38 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
            *)local_40,
           (long)(nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2,&local_38,&local_49);
  *(Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
    **)(this + 0x30) = this + 0x60;
  *(undefined8 *)(this + 0x38) = 1;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined4 *)(this + 0x50) = 0x3f800000;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(Column_settings **)(this + 0x70) = colSettings;
  puVar3 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    local_48 = this + 0x30;
    do {
      uVar1 = *puVar3;
      __v = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
             *)operator_new(8);
      (__v->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
      __v->rowIndex_ = uVar1;
      *(Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
        **)(*(long *)(this + 0x18) + uVar4 * 8) = __v;
      this_00 = *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
                  **)(this + 8);
      if (this_00 !=
          (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
           *)0x0) {
        if ((ulong)(((long)(this_00->
                           super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_00->
                           super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
            (ulong)(uVar1 + 1)) {
          std::
          vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
          ::resize(this_00,(ulong)(uVar1 + 1));
        }
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>
        ::
        _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>const&>
                  ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>
                    *)((ulong)uVar1 * 0x30 + **(long **)(this + 8)),__v);
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::Vector_column(Index columnIndex,
                                                   const Container& nonZeroRowIndices,
                                                   Dimension dimension,
                                                   Row_container* rowContainer,
                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size(), nullptr),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, i++);
    }
  } else {
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, i++);
    }
  }
}